

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

int sbit_modify(png_modifier *pm,png_modification *me,int add)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  
  bVar1 = *(byte *)&me[1].next;
  if (bVar1 < pm->bit_depth) {
    bVar2 = pm->colour_type;
    if ((6 < (ulong)bVar2) || ((0x5dU >> (bVar2 & 0x1f) & 1) == 0)) {
      png_error((pm->this).pread,"unexpected colour type in sBIT modification");
    }
    uVar4 = (ulong)*(uint *)(&DAT_00112530 + (ulong)bVar2 * 4);
    png_save_uint_32(pm->buffer,uVar4);
    png_save_uint_32(pm->buffer + 4,0x73424954);
    iVar3 = 1;
    for (; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
      pm->buffer[uVar4 + 7] = bVar1;
    }
  }
  else {
    iVar3 = 0;
    if (add == 0) {
      pm->buffer_count = 0;
      pm->buffer_position = 0;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int
sbit_modify(png_modifier *pm, png_modification *me, int add)
{
   png_byte sbit = ((sbit_modification*)me)->sbit;
   if (pm->bit_depth > sbit)
   {
      int cb = 0;
      switch (pm->colour_type)
      {
         case 0:
            cb = 1;
            break;

         case 2:
         case 3:
            cb = 3;
            break;

         case 4:
            cb = 2;
            break;

         case 6:
            cb = 4;
            break;

         default:
            png_error(pm->this.pread,
               "unexpected colour type in sBIT modification");
      }

      png_save_uint_32(pm->buffer, cb);
      png_save_uint_32(pm->buffer+4, CHUNK_sBIT);

      while (cb > 0)
         (pm->buffer+8)[--cb] = sbit;

      return 1;
   }
   else if (!add)
   {
      /* Remove the sBIT chunk */
      pm->buffer_count = pm->buffer_position = 0;
      return 1;
   }
   else
      return 0; /* do nothing */
}